

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O1

void ZopfliBlockSplit(ZopfliOptions *options,uchar *in,size_t instart,size_t inend,size_t maxblocks,
                     size_t **splitpoints,size_t *npoints)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  size_t *psVar4;
  size_t sVar5;
  size_t *psVar6;
  ulong uVar7;
  ulong uVar8;
  size_t *lz77splitpoints;
  size_t nlz77points;
  ZopfliLZ77Store store;
  ZopfliBlockState s;
  ZopfliHash hash;
  size_t *local_f8;
  size_t local_f0;
  size_t local_e8;
  ZopfliLZ77Store local_e0;
  ZopfliBlockState local_98;
  ZopfliHash local_78;
  
  local_f8 = (size_t *)0x0;
  local_e8 = 0;
  local_f0 = maxblocks;
  ZopfliInitLZ77Store(in,&local_e0);
  ZopfliInitBlockState(options,instart,inend,0,&local_98);
  ZopfliAllocHash(0x8000,&local_78);
  *npoints = 0;
  *splitpoints = (size_t *)0x0;
  ZopfliLZ77Greedy(&local_98,in,instart,inend,&local_e0,&local_78);
  ZopfliBlockSplitLZ77(options,&local_e0,local_f0,&local_f8,&local_e8);
  sVar5 = local_e8;
  psVar4 = local_f8;
  if ((local_e8 != 0) && (local_e0.size != 0)) {
    uVar7 = 0;
    do {
      if (local_e0.dists[uVar7] == 0) {
        uVar8 = 1;
      }
      else {
        uVar8 = (ulong)local_e0.litlens[uVar7];
      }
      uVar1 = *npoints;
      if (uVar7 == psVar4[uVar1]) {
        if ((uVar1 & uVar1 - 1) == 0) {
          if (uVar1 == 0) {
            psVar6 = (size_t *)malloc(8);
          }
          else {
            psVar6 = (size_t *)realloc(*splitpoints,uVar1 << 4);
          }
          *splitpoints = psVar6;
        }
        (*splitpoints)[*npoints] = instart;
        sVar2 = *npoints;
        *npoints = sVar2 + 1;
        if (sVar2 + 1 != sVar5) goto LAB_00107e72;
        bVar3 = false;
      }
      else {
LAB_00107e72:
        instart = instart + uVar8;
        bVar3 = true;
      }
    } while ((bVar3) && (uVar7 = uVar7 + 1, uVar7 < local_e0.size));
  }
  free(local_f8);
  ZopfliCleanBlockState(&local_98);
  ZopfliCleanLZ77Store(&local_e0);
  ZopfliCleanHash(&local_78);
  return;
}

Assistant:

void ZopfliBlockSplit(const ZopfliOptions* options,
                      const unsigned char* in, size_t instart, size_t inend,
                      size_t maxblocks, size_t** splitpoints, size_t* npoints) {
  size_t pos = 0;
  size_t i;
  ZopfliBlockState s;
  size_t* lz77splitpoints = 0;
  size_t nlz77points = 0;
  ZopfliLZ77Store store;
  ZopfliHash hash;
  ZopfliHash* h = &hash;

  ZopfliInitLZ77Store(in, &store);
  ZopfliInitBlockState(options, instart, inend, 0, &s);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  *npoints = 0;
  *splitpoints = 0;

  /* Unintuitively, Using a simple LZ77 method here instead of ZopfliLZ77Optimal
  results in better blocks. */
  ZopfliLZ77Greedy(&s, in, instart, inend, &store, h);

  ZopfliBlockSplitLZ77(options,
                       &store, maxblocks,
                       &lz77splitpoints, &nlz77points);

  /* Convert LZ77 positions to positions in the uncompressed input. */
  pos = instart;
  if (nlz77points > 0) {
    for (i = 0; i < store.size; i++) {
      size_t length = store.dists[i] == 0 ? 1 : store.litlens[i];
      if (lz77splitpoints[*npoints] == i) {
        ZOPFLI_APPEND_DATA(pos, splitpoints, npoints);
        if (*npoints == nlz77points) break;
      }
      pos += length;
    }
  }
  assert(*npoints == nlz77points);

  free(lz77splitpoints);
  ZopfliCleanBlockState(&s);
  ZopfliCleanLZ77Store(&store);
  ZopfliCleanHash(h);
}